

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O0

void tcu::astc::generateBlockCaseTestData
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *dst,
               CompressedTexFormat format,BlockTestType testType)

{
  undefined4 uVar1;
  bool bVar2;
  bool bVar3;
  deUint16 r_;
  deUint32 dVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint *puVar8;
  reference dst_00;
  sbyte sVar9;
  uint uVar10;
  deInt32 local_8918;
  bool local_88fd;
  deInt32 local_88d4;
  deUint32 seed;
  int numBlocks_6;
  AssignBlock128 local_7ca8;
  ISEParams local_7c94;
  undefined1 local_7c8c [8];
  NormalBlockParams blockParams_7;
  deUint32 ccs;
  int numPartitions_3;
  int local_7c3c;
  int local_7c38;
  int i_1;
  int iseBlockNdx_1;
  int blockNdx_5;
  int offset_3;
  int numBlocks_5;
  int numISEBlocksPerBlock_1;
  int numTQValues_1;
  NormalBlockISEInputs iseInputs_5;
  int local_7004;
  int local_7000;
  int endpointNdx;
  int blockNdx_4;
  int offset_2;
  NormalBlockISEInputs iseInputs_4;
  int numBlocks_4;
  int numColorEndpointValues;
  int numValuesInISEBlock_1;
  int numColorEndpoints;
  ISEParams endpointISEParams;
  NormalBlockParams blockParams_6;
  int weightGridHeight_1;
  int weightGridWidth_1;
  int weightISEParamsNdx;
  int isDual;
  int numPartitions_2;
  undefined1 auStack_6388 [3];
  bool validCaseGenerated;
  int endpointRangeNdx;
  int local_6374;
  int local_6370;
  int endpointValue1;
  int endpointValue0;
  int endpointValueNdx1;
  int endpointValueNdx0;
  int numEndpointValues;
  NormalBlockISEInputs iseInputs_3;
  int endpointPartNdx1;
  int endpointPartNdx0;
  int endpointISERangeMax;
  ISEParams endpointISE;
  int numEndpointParts;
  int numBitsForEndpoints;
  undefined1 local_5734 [8];
  NormalBlockParams blockParams_5;
  undefined1 local_56f8 [3];
  bool isHDRCem;
  deUint32 cem;
  AssignBlock128 local_4af0;
  ISEParams local_4adc;
  undefined1 local_4ad4 [8];
  NormalBlockParams blockParams_4;
  deUint32 partitionSeed;
  int numPartitions_1;
  AssignBlock128 local_3e90;
  int local_3e80;
  uint local_3e7c;
  int iseParamsNdx_3;
  deUint32 maxCemClass;
  deUint32 minCemClass;
  deUint32 maxCem;
  deUint32 minCem;
  NormalBlockParams blockParams_3;
  deUint32 cem3;
  deUint32 cem2;
  deUint32 cem1;
  deUint32 cem0;
  AssignBlock128 local_3220;
  int local_320c;
  undefined1 local_3208 [4];
  int iseParamsNdx_2;
  NormalBlockParams blockParams_2;
  deUint32 singleCem;
  int numPartitions;
  int isDualPlane_1;
  int local_31b4;
  int local_31b0;
  int i;
  int iseBlockNdx;
  int blockNdx_3;
  int offset_1;
  int numBlocks_3;
  int numISEBlocksPerBlock;
  int numTQValues;
  NormalBlockISEInputs iseInputs_2;
  int local_2580;
  int local_257c;
  int weightNdx;
  int blockNdx_2;
  int offset;
  NormalBlockISEInputs iseInputs_1;
  int numBlocks_2;
  int numWeightValues;
  int numWeights;
  int numValuesInISEBlock;
  NormalBlockParams blockParams_1;
  ISEParams *iseParams;
  undefined1 local_1918 [4];
  int iseParamsNdx_1;
  AssignBlock128 local_d10;
  undefined1 local_d00 [8];
  NormalBlockISEInputs iseInputs;
  NormalBlockParams blockParams;
  int weightGridHeight;
  int weightGridWidth;
  int iseParamsNdx;
  int isDualPlane;
  AssignBlock128 local_a8;
  deFloat16 local_94;
  deUint16 local_92;
  deFloat16 local_90;
  deFloat16 local_8e;
  deFloat16 a_1;
  deFloat16 b_1;
  deFloat16 g_1;
  deFloat16 r_1;
  int aNdx;
  int bNdx;
  int gNdx;
  int rNdx;
  int blockNdx_1;
  int numBlocks_1;
  float maxValue;
  float minValue;
  AssignBlock128 local_60;
  undefined1 local_50 [8];
  AssignBlock128 block;
  deUint16 a;
  deUint16 b;
  deUint16 g;
  deUint16 r;
  deUint32 baseValue;
  int blockNdx;
  deUint32 numValues;
  int numBlocks;
  IVec3 blockSize;
  BlockTestType testType_local;
  CompressedTexFormat format_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *dst_local;
  
  blockSize.m_data[1] = testType;
  blockSize.m_data[2] = format;
  getBlockPixelSize((tcu *)&numValues,format);
  switch(blockSize.m_data[1]) {
  case 0:
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(dst,0x20000);
    for (_g = 0; _g < 0x2000; _g = _g + 1) {
      r_ = (deUint16)((uint)(_g * 0xffff) / 0x1fff);
      block.m_words[1]._6_2_ = r_ + 0x8000;
      block.m_words[1]._4_2_ = r_ + 0xc000;
      anon_unknown_0::AssignBlock128::AssignBlock128((AssignBlock128 *)local_50);
      anon_unknown_0::VoidExtentParams::VoidExtentParams
                ((VoidExtentParams *)((long)&maxValue + 2),false,r_,r_ + 0x4000,
                 block.m_words[1]._6_2_,block.m_words[1]._4_2_);
      local_60 = anon_unknown_0::generateVoidExtentBlock((VoidExtentParams *)((long)&maxValue + 2));
      anon_unknown_0::AssignBlock128::pushBytesToVector(&local_60,dst);
    }
    break;
  case 1:
    numBlocks_1 = -0x38802000;
    blockNdx_1 = 0x477fe000;
    rNdx = 0x2000;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(dst,0x20000);
    for (gNdx = 0; gNdx < 0x2000; gNdx = gNdx + 1) {
      bNdx = gNdx % 0x2000;
      aNdx = (gNdx + 0x800) % 0x2000;
      _g_1 = (gNdx + 0x1000) % 0x2000;
      _a_1 = (gNdx + 0x1800) % 0x2000;
      local_8e = deFloat32To16(((float)bNdx * 131008.0) / 8191.0 + -65504.0);
      local_90 = deFloat32To16(((float)aNdx * 131008.0) / 8191.0 + -65504.0);
      local_92 = deFloat32To16(((float)_g_1 * 131008.0) / 8191.0 + -65504.0);
      local_94 = deFloat32To16(((float)_a_1 * 131008.0) / 8191.0 + -65504.0);
      anon_unknown_0::VoidExtentParams::VoidExtentParams
                ((VoidExtentParams *)((long)&iseParamsNdx + 2),true,local_8e,local_90,local_92,
                 local_94);
      local_a8 = anon_unknown_0::generateVoidExtentBlock
                           ((VoidExtentParams *)((long)&iseParamsNdx + 2));
      anon_unknown_0::AssignBlock128::pushBytesToVector(&local_a8,dst);
    }
    break;
  case 2:
    for (weightGridWidth = 0; weightGridWidth < 2; weightGridWidth = weightGridWidth + 1) {
      for (weightGridHeight = 0; weightGridHeight < 0xc; weightGridHeight = weightGridHeight + 1) {
        for (blockParams.partitionSeed = 2; (int)blockParams.partitionSeed < 0xd;
            blockParams.partitionSeed = blockParams.partitionSeed + 1) {
          blockParams.isMultiPartSingleCemMode = true;
          blockParams._45_3_ = 0;
          for (; (int)blockParams._44_4_ < 0xd; blockParams._44_4_ = blockParams._44_4_ + 1) {
            anon_unknown_0::NormalBlockParams::NormalBlockParams
                      ((NormalBlockParams *)((long)&iseInputs.endpoint.value + 0x5f8));
            anon_unknown_0::NormalBlockISEInputs::NormalBlockISEInputs
                      ((NormalBlockISEInputs *)local_d00);
            iseInputs.endpoint.value.block[0x3f].bitValues[3] = blockParams.partitionSeed;
            iseInputs.endpoint.value.block[0x3f].bitValues[4] = blockParams._44_4_;
            iVar6 = Vector<int,_3>::x((Vector<int,_3> *)&numValues);
            iVar7 = Vector<int,_3>::y((Vector<int,_3> *)&numValues);
            bVar2 = anon_unknown_0::isValidBlockParams
                              ((NormalBlockParams *)((long)&iseInputs.endpoint.value + 0x5f8),iVar6,
                               iVar7);
            if (bVar2) {
              iVar6 = Vector<int,_3>::x((Vector<int,_3> *)&numValues);
              iVar7 = Vector<int,_3>::y((Vector<int,_3> *)&numValues);
              anon_unknown_0::generateDefaultISEInputs
                        ((NormalBlockISEInputs *)local_1918,
                         (NormalBlockParams *)((long)&iseInputs.endpoint.value + 0x5f8));
              local_d10 = anon_unknown_0::generateNormalBlock
                                    ((NormalBlockParams *)((long)&iseInputs.endpoint.value + 0x5f8),
                                     iVar6,iVar7,(NormalBlockISEInputs *)local_1918);
              anon_unknown_0::AssignBlock128::pushBytesToVector(&local_d10,dst);
            }
          }
        }
      }
    }
    break;
  case 3:
    for (iseParams._4_4_ = 0; iseParams._4_4_ < 0xc; iseParams._4_4_ = iseParams._4_4_ + 1) {
      blockParams_1._44_8_ =
           (anonymous_namespace)::s_weightISEParamsCandidates + (long)iseParams._4_4_ * 8;
      anon_unknown_0::NormalBlockParams::NormalBlockParams((NormalBlockParams *)&numWeights);
      numWeights = 4;
      numValuesInISEBlock = 4;
      blockParams_1._0_8_ = *(undefined8 *)blockParams_1._44_8_;
      blockParams_1.isDualPlane = true;
      blockParams_1._17_3_ = 0;
      blockParams_1.weightISEParams.mode._0_1_ = ISEMODE_QUINT;
      blockParams_1.weightISEParams.numBits = 0;
      blockParams_1.ccs = 0;
      while( true ) {
        iVar6 = Vector<int,_3>::x((Vector<int,_3> *)&numValues);
        iVar7 = Vector<int,_3>::y((Vector<int,_3> *)&numValues);
        bVar2 = anon_unknown_0::isValidBlockParams((NormalBlockParams *)&numWeights,iVar6,iVar7);
        if (((bVar2 ^ 0xffU) & 1) == 0) break;
        numWeights = numWeights + -1;
        numValuesInISEBlock = numValuesInISEBlock + -1;
      }
      if (*(int *)blockParams_1._44_8_ == 0) {
        local_88d4 = 5;
      }
      else {
        local_88d4 = 1;
        if (*(int *)blockParams_1._44_8_ == 1) {
          local_88d4 = 3;
        }
      }
      iVar6 = anon_unknown_0::computeNumWeights((NormalBlockParams *)&numWeights);
      dVar4 = anon_unknown_0::computeISERangeMax((ISEParams *)blockParams_1._44_8_);
      iseInputs_1.endpoint.value.block[0x3f].bitValues[4] = dVar4 + 1;
      iseInputs_1.endpoint.value.block[0x3f].bitValues[3] =
           deDivRoundUp32(iseInputs_1.endpoint.value.block[0x3f].bitValues[4],iVar6);
      anon_unknown_0::generateDefaultISEInputs
                ((NormalBlockISEInputs *)&blockNdx_2,(NormalBlockParams *)&numWeights);
      blockNdx_2._0_1_ = 0;
      for (weightNdx = 0; weightNdx < local_88d4; weightNdx = weightNdx + 1) {
        for (local_257c = 0; local_257c < (int)iseInputs_1.endpoint.value.block[0x3f].bitValues[3];
            local_257c = local_257c + 1) {
          for (local_2580 = 0; local_2580 < iVar6; local_2580 = local_2580 + 1) {
            (&offset)[local_2580] =
                 (local_257c * iVar6 + local_2580 + weightNdx) %
                 (int)iseInputs_1.endpoint.value.block[0x3f].bitValues[4];
          }
          iVar7 = Vector<int,_3>::x((Vector<int,_3> *)&numValues);
          iVar5 = Vector<int,_3>::y((Vector<int,_3> *)&numValues);
          join_0x00000010_0x00000000_ =
               anon_unknown_0::generateNormalBlock
                         ((NormalBlockParams *)&numWeights,iVar7,iVar5,
                          (NormalBlockISEInputs *)&blockNdx_2);
          anon_unknown_0::AssignBlock128::pushBytesToVector
                    ((AssignBlock128 *)((long)&iseInputs_2.endpoint.value + 0x5f8),dst);
        }
      }
      if ((*(int *)blockParams_1._44_8_ == 0) || (*(int *)blockParams_1._44_8_ == 1)) {
        anon_unknown_0::generateDefaultISEInputs
                  ((NormalBlockISEInputs *)&numISEBlocksPerBlock,(NormalBlockParams *)&numWeights);
        numISEBlocksPerBlock._0_1_ = 1;
        sVar9 = 7;
        if (*(int *)blockParams_1._44_8_ == 0) {
          sVar9 = 8;
        }
        numBlocks_3 = 1 << sVar9;
        offset_1 = deDivRoundUp32(iVar6,local_88d4);
        blockNdx_3 = deDivRoundUp32(numBlocks_3,offset_1);
        for (iseBlockNdx = 0; iseBlockNdx < local_88d4; iseBlockNdx = iseBlockNdx + 1) {
          for (i = 0; i < blockNdx_3; i = i + 1) {
            for (local_31b0 = 0; local_31b0 < offset_1; local_31b0 = local_31b0 + 1) {
              for (local_31b4 = 0; local_31b4 < local_88d4; local_31b4 = local_31b4 + 1) {
                *(undefined4 *)
                 (&iseInputs_2.weight.isGivenInBlockForm +
                 (long)local_31b4 * 4 + (long)local_31b0 * 0x18) = 0;
              }
              (&numTQValues)[(long)local_31b0 * 6] =
                   (i * offset_1 + local_31b0 + iseBlockNdx) % numBlocks_3;
            }
            iVar6 = Vector<int,_3>::x((Vector<int,_3> *)&numValues);
            iVar7 = Vector<int,_3>::y((Vector<int,_3> *)&numValues);
            _numPartitions =
                 anon_unknown_0::generateNormalBlock
                           ((NormalBlockParams *)&numWeights,iVar6,iVar7,
                            (NormalBlockISEInputs *)&numISEBlocksPerBlock);
            anon_unknown_0::AssignBlock128::pushBytesToVector((AssignBlock128 *)&numPartitions,dst);
          }
        }
      }
    }
    break;
  case 4:
    for (singleCem = 0; (int)singleCem < 2; singleCem = singleCem + 1) {
      blockParams_2.partitionSeed = 1;
      while( true ) {
        iVar6 = 4;
        if (singleCem != 0) {
          iVar6 = 3;
        }
        if (iVar6 < (int)blockParams_2.partitionSeed) break;
        if (1 < (int)blockParams_2.partitionSeed) {
          blockParams_2.isMultiPartSingleCemMode = false;
          blockParams_2._45_3_ = 0;
          for (; (uint)blockParams_2._44_4_ < 0x10; blockParams_2._44_4_ = blockParams_2._44_4_ + 1)
          {
            anon_unknown_0::NormalBlockParams::NormalBlockParams((NormalBlockParams *)local_3208);
            local_3208 = (undefined1  [4])0x4;
            iseParamsNdx_2 = 4;
            blockParams_2.weightISEParams.mode._0_1_ = singleCem != 0;
            blockParams_2.weightISEParams.numBits = 0;
            blockParams_2._16_4_ = blockParams_2.partitionSeed;
            blockParams_2.colorEndpointModes[2]._0_1_ = 1;
            blockParams_2.ccs = blockParams_2._44_4_;
            blockParams_2.colorEndpointModes[3] = 0x27a;
            for (local_320c = 0; local_320c < 0xc; local_320c = local_320c + 1) {
              blockParams_2._0_8_ =
                   *(undefined8 *)
                    ((anonymous_namespace)::s_weightISEParamsCandidates + (long)local_320c * 8);
              iVar6 = Vector<int,_3>::x((Vector<int,_3> *)&numValues);
              iVar7 = Vector<int,_3>::y((Vector<int,_3> *)&numValues);
              bVar2 = anon_unknown_0::isValidBlockParams
                                ((NormalBlockParams *)local_3208,iVar6,iVar7);
              if (bVar2) {
                iVar6 = Vector<int,_3>::x((Vector<int,_3> *)&numValues);
                iVar7 = Vector<int,_3>::y((Vector<int,_3> *)&numValues);
                anon_unknown_0::generateDefaultISEInputs
                          ((NormalBlockISEInputs *)&cem1,(NormalBlockParams *)local_3208);
                local_3220 = anon_unknown_0::generateNormalBlock
                                       ((NormalBlockParams *)local_3208,iVar6,iVar7,
                                        (NormalBlockISEInputs *)&cem1);
                anon_unknown_0::AssignBlock128::pushBytesToVector(&local_3220,dst);
                break;
              }
            }
          }
        }
        for (cem2 = 0; cem2 < 0x10; cem2 = cem2 + 1) {
          cem3 = 0;
          while( true ) {
            uVar10 = 1;
            if (1 < (int)blockParams_2.partitionSeed) {
              uVar10 = 0x10;
            }
            if (uVar10 <= cem3) break;
            blockParams_3.partitionSeed = 0;
            while( true ) {
              uVar10 = 1;
              if (2 < (int)blockParams_2.partitionSeed) {
                uVar10 = 0x10;
              }
              if (uVar10 <= blockParams_3.partitionSeed) break;
              blockParams_3.isMultiPartSingleCemMode = false;
              blockParams_3._45_3_ = 0;
              while( true ) {
                uVar10 = 1;
                if (3 < (int)blockParams_2.partitionSeed) {
                  uVar10 = 0x10;
                }
                if (uVar10 <= (uint)blockParams_3._44_4_) break;
                anon_unknown_0::NormalBlockParams::NormalBlockParams((NormalBlockParams *)&maxCem);
                maxCem = 4;
                minCem = 4;
                blockParams_3.weightISEParams.mode._0_1_ = singleCem != 0;
                blockParams_3.weightISEParams.numBits = 0;
                blockParams_3._16_4_ = blockParams_2.partitionSeed;
                blockParams_3.colorEndpointModes[2]._0_1_ = 0;
                blockParams_3.ccs = cem2;
                blockParams_3.numPartitions = cem3;
                blockParams_3.colorEndpointModes[0] = blockParams_3.partitionSeed;
                blockParams_3.colorEndpointModes[1] = blockParams_3._44_4_;
                blockParams_3.colorEndpointModes[3] = 0x27a;
                puVar8 = std::min_element<unsigned_int*>
                                   (&blockParams_3.ccs,
                                    blockParams_3.colorEndpointModes +
                                    (long)(int)blockParams_2.partitionSeed + -2);
                minCemClass = *puVar8;
                puVar8 = std::max_element<unsigned_int*>
                                   (&blockParams_3.ccs,
                                    blockParams_3.colorEndpointModes +
                                    (long)(int)blockParams_2.partitionSeed + -2);
                maxCemClass = *puVar8;
                iseParamsNdx_3 = minCemClass >> 2;
                local_3e7c = maxCemClass >> 2;
                if (local_3e7c - iseParamsNdx_3 < 2) {
                  for (local_3e80 = 0; local_3e80 < 0xc; local_3e80 = local_3e80 + 1) {
                    blockParams_3._0_8_ =
                         *(undefined8 *)
                          ((anonymous_namespace)::s_weightISEParamsCandidates + (long)local_3e80 * 8
                          );
                    iVar6 = Vector<int,_3>::x((Vector<int,_3> *)&numValues);
                    iVar7 = Vector<int,_3>::y((Vector<int,_3> *)&numValues);
                    bVar2 = anon_unknown_0::isValidBlockParams
                                      ((NormalBlockParams *)&maxCem,iVar6,iVar7);
                    if (bVar2) {
                      iVar6 = Vector<int,_3>::x((Vector<int,_3> *)&numValues);
                      iVar7 = Vector<int,_3>::y((Vector<int,_3> *)&numValues);
                      anon_unknown_0::generateDefaultISEInputs
                                ((NormalBlockISEInputs *)&partitionSeed,(NormalBlockParams *)&maxCem
                                );
                      local_3e90 = anon_unknown_0::generateNormalBlock
                                             ((NormalBlockParams *)&maxCem,iVar6,iVar7,
                                              (NormalBlockISEInputs *)&partitionSeed);
                      anon_unknown_0::AssignBlock128::pushBytesToVector(&local_3e90,dst);
                      break;
                    }
                  }
                }
                blockParams_3._44_4_ = blockParams_3._44_4_ + 1;
              }
              blockParams_3.partitionSeed = blockParams_3.partitionSeed + 1;
            }
            cem3 = cem3 + 1;
          }
        }
        blockParams_2.partitionSeed = blockParams_2.partitionSeed + 1;
      }
    }
    break;
  case 5:
    for (blockParams_4.partitionSeed = 2; (int)blockParams_4.partitionSeed < 5;
        blockParams_4.partitionSeed = blockParams_4.partitionSeed + 1) {
      blockParams_4.isMultiPartSingleCemMode = false;
      blockParams_4._45_3_ = 0;
      for (; (uint)blockParams_4._44_4_ < 0x400; blockParams_4._44_4_ = blockParams_4._44_4_ + 1) {
        anon_unknown_0::NormalBlockParams::NormalBlockParams((NormalBlockParams *)local_4ad4);
        local_4ad4._0_4_ = 4;
        local_4ad4._4_4_ = 4;
        anon_unknown_0::ISEParams::ISEParams(&local_4adc,ISEMODE_PLAIN_BIT,2);
        blockParams_4.weightGridWidth = local_4adc.mode;
        blockParams_4.weightGridHeight = local_4adc.numBits;
        blockParams_4.weightISEParams.mode._0_1_ = ISEMODE_TRIT;
        blockParams_4._16_4_ = blockParams_4.partitionSeed;
        blockParams_4.colorEndpointModes[2]._0_1_ = 1;
        blockParams_4.ccs = 0;
        blockParams_4.colorEndpointModes[3] = blockParams_4._44_4_;
        iVar6 = Vector<int,_3>::x((Vector<int,_3> *)&numValues);
        iVar7 = Vector<int,_3>::y((Vector<int,_3> *)&numValues);
        anon_unknown_0::generateDefaultISEInputs
                  ((NormalBlockISEInputs *)local_56f8,(NormalBlockParams *)local_4ad4);
        local_4af0 = anon_unknown_0::generateNormalBlock
                               ((NormalBlockParams *)local_4ad4,iVar6,iVar7,
                                (NormalBlockISEInputs *)local_56f8);
        anon_unknown_0::AssignBlock128::pushBytesToVector(&local_4af0,dst);
      }
    }
    break;
  case 6:
  case 7:
  case 8:
    for (blockParams_5.partitionSeed = 0; blockParams_5.partitionSeed < 0x10;
        blockParams_5.partitionSeed = blockParams_5.partitionSeed + 1) {
      local_88fd = true;
      if ((((blockParams_5.partitionSeed != 2) &&
           (local_88fd = true, blockParams_5.partitionSeed != 3)) &&
          (local_88fd = true, blockParams_5.partitionSeed != 7)) &&
         ((local_88fd = true, blockParams_5.partitionSeed != 0xb &&
          (local_88fd = true, blockParams_5.partitionSeed != 0xe)))) {
        local_88fd = blockParams_5.partitionSeed == 0xf;
      }
      blockParams_5._47_1_ = local_88fd;
      if ((((blockSize.m_data[1] != 6) || (local_88fd == false)) &&
          ((blockSize.m_data[1] != 7 ||
           ((local_88fd != false && (blockParams_5.partitionSeed != 0xf)))))) &&
         ((blockSize.m_data[1] != 8 || (blockParams_5.partitionSeed == 0xf)))) {
        anon_unknown_0::NormalBlockParams::NormalBlockParams((NormalBlockParams *)local_5734);
        local_5734._0_4_ = 3;
        local_5734._4_4_ = 4;
        anon_unknown_0::ISEParams::ISEParams((ISEParams *)&numEndpointParts,ISEMODE_PLAIN_BIT,2);
        blockParams_5.weightGridWidth = numEndpointParts;
        blockParams_5.weightGridHeight = numBitsForEndpoints;
        blockParams_5.weightISEParams.mode._0_1_ = ISEMODE_TRIT;
        blockParams_5.isDualPlane = true;
        blockParams_5._17_3_ = 0;
        blockParams_5.ccs = blockParams_5.partitionSeed;
        endpointISE.numBits =
             anon_unknown_0::computeNumBitsForColorEndpoints((NormalBlockParams *)local_5734);
        endpointISE.mode =
             anon_unknown_0::computeNumColorEndpointValues(blockParams_5.partitionSeed);
        _endpointPartNdx0 =
             anon_unknown_0::computeMaximumRangeISEParams(endpointISE.numBits,endpointISE.mode);
        dVar4 = anon_unknown_0::computeISERangeMax((ISEParams *)&endpointPartNdx0);
        for (iseInputs_3.endpoint.value.block[0x3f].bitValues[4] = 0;
            uVar1 = iseInputs_3.endpoint.value.block[0x3f].bitValues[4],
            (int)iseInputs_3.endpoint.value.block[0x3f].bitValues[4] < (int)endpointISE.mode;
            iseInputs_3.endpoint.value.block[0x3f].bitValues[4] =
                 iseInputs_3.endpoint.value.block[0x3f].bitValues[4] + 1) {
          while (iseInputs_3.endpoint.value.block[0x3f].bitValues[3] = uVar1 + 1,
                (int)iseInputs_3.endpoint.value.block[0x3f].bitValues[3] < (int)endpointISE.mode) {
            anon_unknown_0::generateDefaultISEInputs
                      ((NormalBlockISEInputs *)&endpointValueNdx0,(NormalBlockParams *)local_5734);
            endpointValueNdx1 = de::min<int>(10,dVar4 + 1);
            for (endpointValue0 = 0; uVar1 = iseInputs_3.endpoint.value.block[0x3f].bitValues[3],
                endpointValue0 < endpointValueNdx1; endpointValue0 = endpointValue0 + 1) {
              for (endpointValue1 = 0; endpointValue1 < endpointValueNdx1;
                  endpointValue1 = endpointValue1 + 1) {
                local_6370 = (int)(endpointValue0 * dVar4) / (endpointValueNdx1 + -1);
                local_6374 = (int)(endpointValue1 * dVar4) / (endpointValueNdx1 + -1);
                *(int *)((long)&iseInputs_3.weight.value +
                        (long)(int)iseInputs_3.endpoint.value.block[0x3f].bitValues[4] * 4 + 0x5fc)
                     = local_6370;
                *(int *)((long)&iseInputs_3.weight.value +
                        (long)(int)iseInputs_3.endpoint.value.block[0x3f].bitValues[3] * 4 + 0x5fc)
                     = local_6374;
                iVar6 = Vector<int,_3>::x((Vector<int,_3> *)&numValues);
                iVar7 = Vector<int,_3>::y((Vector<int,_3> *)&numValues);
                _auStack_6388 =
                     anon_unknown_0::generateNormalBlock
                               ((NormalBlockParams *)local_5734,iVar6,iVar7,
                                (NormalBlockISEInputs *)&endpointValueNdx0);
                anon_unknown_0::AssignBlock128::pushBytesToVector
                          ((AssignBlock128 *)auStack_6388,dst);
              }
            }
          }
        }
      }
    }
    break;
  case 9:
    for (numPartitions_2 = 0; numPartitions_2 < 0xb; numPartitions_2 = numPartitions_2 + 1) {
      bVar2 = false;
      for (weightISEParamsNdx = 1; !bVar2 && weightISEParamsNdx < 5;
          weightISEParamsNdx = weightISEParamsNdx + 1) {
        for (weightGridWidth_1 = 0; !bVar2 && weightGridWidth_1 < 2;
            weightGridWidth_1 = weightGridWidth_1 + 1) {
          for (weightGridHeight_1 = 0; !bVar2 && weightGridHeight_1 < 0xc;
              weightGridHeight_1 = weightGridHeight_1 + 1) {
            for (blockParams_6.partitionSeed = 2; !bVar2 && (int)blockParams_6.partitionSeed < 0xd;
                blockParams_6.partitionSeed = blockParams_6.partitionSeed + 1) {
              blockParams_6.isMultiPartSingleCemMode = true;
              blockParams_6._45_3_ = 0;
              for (; !bVar2 && (int)blockParams_6._44_4_ < 0xd;
                  blockParams_6._44_4_ = blockParams_6._44_4_ + 1) {
                anon_unknown_0::NormalBlockParams::NormalBlockParams
                          ((NormalBlockParams *)&endpointISEParams);
                endpointISEParams.mode = blockParams_6.partitionSeed;
                endpointISEParams.numBits = blockParams_6._44_4_;
                blockParams_6._0_8_ =
                     *(undefined8 *)
                      ((anonymous_namespace)::s_weightISEParamsCandidates +
                      (long)weightGridHeight_1 * 8);
                blockParams_6.weightISEParams.mode._0_1_ = weightGridWidth_1 != 0;
                blockParams_6.weightISEParams.numBits = 0;
                blockParams_6._16_4_ = weightISEParamsNdx;
                blockParams_6.colorEndpointModes[2]._0_1_ = 1;
                blockParams_6.ccs = 0xc;
                blockParams_6.colorEndpointModes[3] = 0x27a;
                iVar6 = Vector<int,_3>::x((Vector<int,_3> *)&numValues);
                iVar7 = Vector<int,_3>::y((Vector<int,_3> *)&numValues);
                bVar3 = anon_unknown_0::isValidBlockParams
                                  ((NormalBlockParams *)&endpointISEParams,iVar6,iVar7);
                if (bVar3) {
                  iVar6 = anon_unknown_0::computeNumBitsForColorEndpoints
                                    ((NormalBlockParams *)&endpointISEParams);
                  iVar7 = anon_unknown_0::computeNumColorEndpointValues
                                    (&blockParams_6.ccs,weightISEParamsNdx,true);
                  _numValuesInISEBlock_1 = anon_unknown_0::computeMaximumRangeISEParams(iVar6,iVar7)
                  ;
                  dVar4 = anon_unknown_0::computeISERangeMax((ISEParams *)&numValuesInISEBlock_1);
                  if (dVar4 == generateBlockCaseTestData::endpointRangeMaximums[numPartitions_2]) {
                    bVar2 = true;
                    iVar6 = anon_unknown_0::computeNumColorEndpointValues
                                      (&blockParams_6.ccs,weightISEParamsNdx,
                                       (bool)((byte)blockParams_6.colorEndpointModes[2] & 1));
                    if (numValuesInISEBlock_1 == 0) {
                      local_8918 = 5;
                    }
                    else {
                      local_8918 = 1;
                      if (numValuesInISEBlock_1 == 1) {
                        local_8918 = 3;
                      }
                    }
                    dVar4 = anon_unknown_0::computeISERangeMax((ISEParams *)&numValuesInISEBlock_1);
                    iseInputs_4.endpoint.value.block[0x3f].bitValues[4] = dVar4 + 1;
                    iseInputs_4.endpoint.value.block[0x3f].bitValues[3] =
                         deDivRoundUp32(iseInputs_4.endpoint.value.block[0x3f].bitValues[4],iVar6);
                    anon_unknown_0::generateDefaultISEInputs
                              ((NormalBlockISEInputs *)&blockNdx_4,
                               (NormalBlockParams *)&endpointISEParams);
                    iseInputs_4.weight.value.block[0x3f].bitValues[3]._0_1_ = 0;
                    for (endpointNdx = 0; endpointNdx < local_8918; endpointNdx = endpointNdx + 1) {
                      for (local_7000 = 0;
                          local_7000 < (int)iseInputs_4.endpoint.value.block[0x3f].bitValues[3];
                          local_7000 = local_7000 + 1) {
                        for (local_7004 = 0; local_7004 < iVar6; local_7004 = local_7004 + 1) {
                          *(int *)((long)&iseInputs_4.weight.value + (long)local_7004 * 4 + 0x5fc) =
                               (local_7000 * iVar6 + local_7004 + endpointNdx) %
                               (int)iseInputs_4.endpoint.value.block[0x3f].bitValues[4];
                        }
                        iVar7 = Vector<int,_3>::x((Vector<int,_3> *)&numValues);
                        iVar5 = Vector<int,_3>::y((Vector<int,_3> *)&numValues);
                        join_0x00000010_0x00000000_ =
                             anon_unknown_0::generateNormalBlock
                                       ((NormalBlockParams *)&endpointISEParams,iVar7,iVar5,
                                        (NormalBlockISEInputs *)&blockNdx_4);
                        anon_unknown_0::AssignBlock128::pushBytesToVector
                                  ((AssignBlock128 *)((long)&iseInputs_5.endpoint.value + 0x5f8),dst
                                  );
                      }
                    }
                    if ((numValuesInISEBlock_1 == 0) || (numValuesInISEBlock_1 == 1)) {
                      anon_unknown_0::generateDefaultISEInputs
                                ((NormalBlockISEInputs *)&numISEBlocksPerBlock_1,
                                 (NormalBlockParams *)&endpointISEParams);
                      iseInputs_5.weight.value.block[0x3f].bitValues[3]._0_1_ = 1;
                      sVar9 = 7;
                      if (numValuesInISEBlock_1 == 0) {
                        sVar9 = 8;
                      }
                      numBlocks_5 = 1 << sVar9;
                      offset_3 = deDivRoundUp32(iVar6,local_8918);
                      blockNdx_5 = deDivRoundUp32(numBlocks_5,offset_3);
                      for (iseBlockNdx_1 = 0; iseBlockNdx_1 < local_8918;
                          iseBlockNdx_1 = iseBlockNdx_1 + 1) {
                        for (i_1 = 0; i_1 < blockNdx_5; i_1 = i_1 + 1) {
                          for (local_7c38 = 0; local_7c38 < offset_3; local_7c38 = local_7c38 + 1) {
                            for (local_7c3c = 0; local_7c3c < local_8918;
                                local_7c3c = local_7c3c + 1) {
                              *(undefined4 *)
                               (&iseInputs_5.endpoint.isGivenInBlockForm +
                               (long)local_7c3c * 4 + (long)local_7c38 * 0x18) = 0;
                            }
                            *(int *)((long)&iseInputs_5.weight.value +
                                    (long)local_7c38 * 0x18 + 0x5fc) =
                                 (i_1 * offset_3 + local_7c38 + iseBlockNdx_1) % numBlocks_5;
                          }
                          iVar6 = Vector<int,_3>::x((Vector<int,_3> *)&numValues);
                          iVar7 = Vector<int,_3>::y((Vector<int,_3> *)&numValues);
                          _ccs = anon_unknown_0::generateNormalBlock
                                           ((NormalBlockParams *)&endpointISEParams,iVar6,iVar7,
                                            (NormalBlockISEInputs *)&numISEBlocksPerBlock_1);
                          anon_unknown_0::AssignBlock128::pushBytesToVector
                                    ((AssignBlock128 *)&ccs,dst);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    break;
  case 10:
    for (blockParams_7.partitionSeed = 1; (int)blockParams_7.partitionSeed < 4;
        blockParams_7.partitionSeed = blockParams_7.partitionSeed + 1) {
      blockParams_7.isMultiPartSingleCemMode = false;
      blockParams_7._45_3_ = 0;
      for (; (uint)blockParams_7._44_4_ < 4; blockParams_7._44_4_ = blockParams_7._44_4_ + 1) {
        anon_unknown_0::NormalBlockParams::NormalBlockParams((NormalBlockParams *)local_7c8c);
        local_7c8c._0_4_ = 3;
        local_7c8c._4_4_ = 3;
        anon_unknown_0::ISEParams::ISEParams(&local_7c94,ISEMODE_PLAIN_BIT,2);
        blockParams_7.weightGridWidth = local_7c94.mode;
        blockParams_7.weightGridHeight = local_7c94.numBits;
        blockParams_7.weightISEParams.mode._0_1_ = ISEMODE_QUINT;
        blockParams_7.weightISEParams.numBits = blockParams_7._44_4_;
        blockParams_7._16_4_ = blockParams_7.partitionSeed;
        blockParams_7.colorEndpointModes[2]._0_1_ = 1;
        blockParams_7.ccs = 8;
        blockParams_7.colorEndpointModes[3] = 0x27a;
        iVar6 = Vector<int,_3>::x((Vector<int,_3> *)&numValues);
        iVar7 = Vector<int,_3>::y((Vector<int,_3> *)&numValues);
        anon_unknown_0::generateDefaultISEInputs
                  ((NormalBlockISEInputs *)&seed,(NormalBlockParams *)local_7c8c);
        local_7ca8 = anon_unknown_0::generateNormalBlock
                               ((NormalBlockParams *)local_7c8c,iVar6,iVar7,
                                (NormalBlockISEInputs *)&seed);
        anon_unknown_0::AssignBlock128::pushBytesToVector(&local_7ca8,dst);
      }
    }
    break;
  case 0xb:
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(dst,0x40000);
    dst_00 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](dst,0);
    generateRandomBlocks(dst_00,0x4000,blockSize.m_data[2],1);
  }
  return;
}

Assistant:

void generateBlockCaseTestData (vector<deUint8>& dst, CompressedTexFormat format, BlockTestType testType)
{
	DE_ASSERT(isAstcFormat(format));
	DE_ASSERT(!(isAstcSRGBFormat(format) && isBlockTestTypeHDROnly(testType)));

	const IVec3 blockSize = getBlockPixelSize(format);
	DE_ASSERT(blockSize.z() == 1);

	switch (testType)
	{
		case BLOCK_TEST_TYPE_VOID_EXTENT_LDR:
		// Generate a gradient-like set of LDR void-extent blocks.
		{
			const int			numBlocks	= 1<<13;
			const deUint32		numValues	= 1<<16;
			dst.reserve(numBlocks*BLOCK_SIZE_BYTES);

			for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
			{
				const deUint32 baseValue	= blockNdx*(numValues-1) / (numBlocks-1);
				const deUint16 r			= (deUint16)((baseValue + numValues*0/4) % numValues);
				const deUint16 g			= (deUint16)((baseValue + numValues*1/4) % numValues);
				const deUint16 b			= (deUint16)((baseValue + numValues*2/4) % numValues);
				const deUint16 a			= (deUint16)((baseValue + numValues*3/4) % numValues);
				AssignBlock128 block;

				generateVoidExtentBlock(VoidExtentParams(false, r, g, b, a)).pushBytesToVector(dst);
			}

			break;
		}

		case BLOCK_TEST_TYPE_VOID_EXTENT_HDR:
		// Generate a gradient-like set of HDR void-extent blocks, with values ranging from the largest finite negative to largest finite positive of fp16.
		{
			const float		minValue	= -65504.0f;
			const float		maxValue	= +65504.0f;
			const int		numBlocks	= 1<<13;
			dst.reserve(numBlocks*BLOCK_SIZE_BYTES);

			for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
			{
				const int			rNdx	= (blockNdx + numBlocks*0/4) % numBlocks;
				const int			gNdx	= (blockNdx + numBlocks*1/4) % numBlocks;
				const int			bNdx	= (blockNdx + numBlocks*2/4) % numBlocks;
				const int			aNdx	= (blockNdx + numBlocks*3/4) % numBlocks;
				const deFloat16		r		= deFloat32To16(minValue + (float)rNdx * (maxValue - minValue) / (float)(numBlocks-1));
				const deFloat16		g		= deFloat32To16(minValue + (float)gNdx * (maxValue - minValue) / (float)(numBlocks-1));
				const deFloat16		b		= deFloat32To16(minValue + (float)bNdx * (maxValue - minValue) / (float)(numBlocks-1));
				const deFloat16		a		= deFloat32To16(minValue + (float)aNdx * (maxValue - minValue) / (float)(numBlocks-1));

				generateVoidExtentBlock(VoidExtentParams(true, r, g, b, a)).pushBytesToVector(dst);
			}

			break;
		}

		case BLOCK_TEST_TYPE_WEIGHT_GRID:
		// Generate different combinations of plane count, weight ISE params, and grid size.
		{
			for (int isDualPlane = 0;		isDualPlane <= 1;												isDualPlane++)
			for (int iseParamsNdx = 0;		iseParamsNdx < DE_LENGTH_OF_ARRAY(s_weightISEParamsCandidates);	iseParamsNdx++)
			for (int weightGridWidth = 2;	weightGridWidth <= 12;											weightGridWidth++)
			for (int weightGridHeight = 2;	weightGridHeight <= 12;											weightGridHeight++)
			{
				NormalBlockParams		blockParams;
				NormalBlockISEInputs	iseInputs;

				blockParams.weightGridWidth			= weightGridWidth;
				blockParams.weightGridHeight		= weightGridHeight;
				blockParams.isDualPlane				= isDualPlane != 0;
				blockParams.weightISEParams			= s_weightISEParamsCandidates[iseParamsNdx];
				blockParams.ccs						= 0;
				blockParams.numPartitions			= 1;
				blockParams.colorEndpointModes[0]	= 0;

				if (isValidBlockParams(blockParams, blockSize.x(), blockSize.y()))
					generateNormalBlock(blockParams, blockSize.x(), blockSize.y(), generateDefaultISEInputs(blockParams)).pushBytesToVector(dst);
			}

			break;
		}

		case BLOCK_TEST_TYPE_WEIGHT_ISE:
		// For each weight ISE param set, generate blocks that cover:
		// - each single value of the ISE's range, at each position inside an ISE block
		// - for trit and quint ISEs, each single T or Q value of an ISE block
		{
			for (int iseParamsNdx = 0;	iseParamsNdx < DE_LENGTH_OF_ARRAY(s_weightISEParamsCandidates);	iseParamsNdx++)
			{
				const ISEParams&	iseParams = s_weightISEParamsCandidates[iseParamsNdx];
				NormalBlockParams	blockParams;

				blockParams.weightGridWidth			= 4;
				blockParams.weightGridHeight		= 4;
				blockParams.weightISEParams			= iseParams;
				blockParams.numPartitions			= 1;
				blockParams.isDualPlane				= blockParams.weightGridWidth * blockParams.weightGridHeight < 24 ? true : false;
				blockParams.ccs						= 0;
				blockParams.colorEndpointModes[0]	= 0;

				while (!isValidBlockParams(blockParams, blockSize.x(), blockSize.y()))
				{
					blockParams.weightGridWidth--;
					blockParams.weightGridHeight--;
				}

				const int numValuesInISEBlock	= iseParams.mode == ISEMODE_TRIT ? 5 : iseParams.mode == ISEMODE_QUINT ? 3 : 1;
				const int numWeights			= computeNumWeights(blockParams);

				{
					const int				numWeightValues		= (int)computeISERangeMax(iseParams) + 1;
					const int				numBlocks			= deDivRoundUp32(numWeightValues, numWeights);
					NormalBlockISEInputs	iseInputs			= generateDefaultISEInputs(blockParams);
					iseInputs.weight.isGivenInBlockForm = false;

					for (int offset = 0;	offset < numValuesInISEBlock;	offset++)
					for (int blockNdx = 0;	blockNdx < numBlocks;			blockNdx++)
					{
						for (int weightNdx = 0; weightNdx < numWeights; weightNdx++)
							iseInputs.weight.value.plain[weightNdx] = (blockNdx*numWeights + weightNdx + offset) % numWeightValues;

						generateNormalBlock(blockParams, blockSize.x(), blockSize.y(), iseInputs).pushBytesToVector(dst);
					}
				}

				if (iseParams.mode == ISEMODE_TRIT || iseParams.mode == ISEMODE_QUINT)
				{
					NormalBlockISEInputs iseInputs = generateDefaultISEInputs(blockParams);
					iseInputs.weight.isGivenInBlockForm = true;

					const int numTQValues			= 1 << (iseParams.mode == ISEMODE_TRIT ? 8 : 7);
					const int numISEBlocksPerBlock	= deDivRoundUp32(numWeights, numValuesInISEBlock);
					const int numBlocks				= deDivRoundUp32(numTQValues, numISEBlocksPerBlock);

					for (int offset = 0;	offset < numValuesInISEBlock;	offset++)
					for (int blockNdx = 0;	blockNdx < numBlocks;			blockNdx++)
					{
						for (int iseBlockNdx = 0; iseBlockNdx < numISEBlocksPerBlock; iseBlockNdx++)
						{
							for (int i = 0; i < numValuesInISEBlock; i++)
								iseInputs.weight.value.block[iseBlockNdx].bitValues[i] = 0;
							iseInputs.weight.value.block[iseBlockNdx].tOrQValue = (blockNdx*numISEBlocksPerBlock + iseBlockNdx + offset) % numTQValues;
						}

						generateNormalBlock(blockParams, blockSize.x(), blockSize.y(), iseInputs).pushBytesToVector(dst);
					}
				}
			}

			break;
		}

		case BLOCK_TEST_TYPE_CEMS:
		// For each plane count & partition count combination, generate all color endpoint mode combinations.
		{
			for (int isDualPlane = 0;		isDualPlane <= 1;								isDualPlane++)
			for (int numPartitions = 1;		numPartitions <= (isDualPlane != 0 ? 3 : 4);	numPartitions++)
			{
				// Multi-partition, single-CEM mode.
				if (numPartitions > 1)
				{
					for (deUint32 singleCem = 0; singleCem < 16; singleCem++)
					{
						NormalBlockParams blockParams;
						blockParams.weightGridWidth				= 4;
						blockParams.weightGridHeight			= 4;
						blockParams.isDualPlane					= isDualPlane != 0;
						blockParams.ccs							= 0;
						blockParams.numPartitions				= numPartitions;
						blockParams.isMultiPartSingleCemMode	= true;
						blockParams.colorEndpointModes[0]		= singleCem;
						blockParams.partitionSeed				= 634;

						for (int iseParamsNdx = 0; iseParamsNdx < DE_LENGTH_OF_ARRAY(s_weightISEParamsCandidates); iseParamsNdx++)
						{
							blockParams.weightISEParams = s_weightISEParamsCandidates[iseParamsNdx];
							if (isValidBlockParams(blockParams, blockSize.x(), blockSize.y()))
							{
								generateNormalBlock(blockParams, blockSize.x(), blockSize.y(), generateDefaultISEInputs(blockParams)).pushBytesToVector(dst);
								break;
							}
						}
					}
				}

				// Separate-CEM mode.
				for (deUint32 cem0 = 0; cem0 < 16; cem0++)
				for (deUint32 cem1 = 0; cem1 < (numPartitions >= 2 ? 16u : 1u); cem1++)
				for (deUint32 cem2 = 0; cem2 < (numPartitions >= 3 ? 16u : 1u); cem2++)
				for (deUint32 cem3 = 0; cem3 < (numPartitions >= 4 ? 16u : 1u); cem3++)
				{
					NormalBlockParams blockParams;
					blockParams.weightGridWidth				= 4;
					blockParams.weightGridHeight			= 4;
					blockParams.isDualPlane					= isDualPlane != 0;
					blockParams.ccs							= 0;
					blockParams.numPartitions				= numPartitions;
					blockParams.isMultiPartSingleCemMode	= false;
					blockParams.colorEndpointModes[0]		= cem0;
					blockParams.colorEndpointModes[1]		= cem1;
					blockParams.colorEndpointModes[2]		= cem2;
					blockParams.colorEndpointModes[3]		= cem3;
					blockParams.partitionSeed				= 634;

					{
						const deUint32 minCem		= *std::min_element(&blockParams.colorEndpointModes[0], &blockParams.colorEndpointModes[numPartitions]);
						const deUint32 maxCem		= *std::max_element(&blockParams.colorEndpointModes[0], &blockParams.colorEndpointModes[numPartitions]);
						const deUint32 minCemClass	= minCem/4;
						const deUint32 maxCemClass	= maxCem/4;

						if (maxCemClass - minCemClass > 1)
							continue;
					}

					for (int iseParamsNdx = 0; iseParamsNdx < DE_LENGTH_OF_ARRAY(s_weightISEParamsCandidates); iseParamsNdx++)
					{
						blockParams.weightISEParams = s_weightISEParamsCandidates[iseParamsNdx];
						if (isValidBlockParams(blockParams, blockSize.x(), blockSize.y()))
						{
							generateNormalBlock(blockParams, blockSize.x(), blockSize.y(), generateDefaultISEInputs(blockParams)).pushBytesToVector(dst);
							break;
						}
					}
				}
			}

			break;
		}

		case BLOCK_TEST_TYPE_PARTITION_SEED:
		// Test all partition seeds ("partition pattern indices").
		{
			for (int		numPartitions = 2;	numPartitions <= 4;		numPartitions++)
			for (deUint32	partitionSeed = 0;	partitionSeed < 1<<10;	partitionSeed++)
			{
				NormalBlockParams blockParams;
				blockParams.weightGridWidth				= 4;
				blockParams.weightGridHeight			= 4;
				blockParams.weightISEParams				= ISEParams(ISEMODE_PLAIN_BIT, 2);
				blockParams.isDualPlane					= false;
				blockParams.numPartitions				= numPartitions;
				blockParams.isMultiPartSingleCemMode	= true;
				blockParams.colorEndpointModes[0]		= 0;
				blockParams.partitionSeed				= partitionSeed;

				generateNormalBlock(blockParams, blockSize.x(), blockSize.y(), generateDefaultISEInputs(blockParams)).pushBytesToVector(dst);
			}

			break;
		}

		// \note Fall-through.
		case BLOCK_TEST_TYPE_ENDPOINT_VALUE_LDR:
		case BLOCK_TEST_TYPE_ENDPOINT_VALUE_HDR_NO_15:
		case BLOCK_TEST_TYPE_ENDPOINT_VALUE_HDR_15:
		// For each endpoint mode, for each pair of components in the endpoint value, test 10x10 combinations of values for that pair.
		// \note Separate modes for HDR and mode 15 due to different color scales and biases.
		{
			for (deUint32 cem = 0; cem < 16; cem++)
			{
				const bool isHDRCem = cem == 2		||
									  cem == 3		||
									  cem == 7		||
									  cem == 11		||
									  cem == 14		||
									  cem == 15;

				if ((testType == BLOCK_TEST_TYPE_ENDPOINT_VALUE_LDR			&& isHDRCem)					||
					(testType == BLOCK_TEST_TYPE_ENDPOINT_VALUE_HDR_NO_15		&& (!isHDRCem || cem == 15))	||
					(testType == BLOCK_TEST_TYPE_ENDPOINT_VALUE_HDR_15		&& cem != 15))
					continue;

				NormalBlockParams blockParams;
				blockParams.weightGridWidth			= 3;
				blockParams.weightGridHeight		= 4;
				blockParams.weightISEParams			= ISEParams(ISEMODE_PLAIN_BIT, 2);
				blockParams.isDualPlane				= false;
				blockParams.numPartitions			= 1;
				blockParams.colorEndpointModes[0]	= cem;

				{
					const int			numBitsForEndpoints		= computeNumBitsForColorEndpoints(blockParams);
					const int			numEndpointParts		= computeNumColorEndpointValues(cem);
					const ISEParams		endpointISE				= computeMaximumRangeISEParams(numBitsForEndpoints, numEndpointParts);
					const int			endpointISERangeMax		= computeISERangeMax(endpointISE);

					for (int endpointPartNdx0 = 0;						endpointPartNdx0 < numEndpointParts; endpointPartNdx0++)
					for (int endpointPartNdx1 = endpointPartNdx0+1;		endpointPartNdx1 < numEndpointParts; endpointPartNdx1++)
					{
						NormalBlockISEInputs	iseInputs			= generateDefaultISEInputs(blockParams);
						const int				numEndpointValues	= de::min(10, endpointISERangeMax+1);

						for (int endpointValueNdx0 = 0; endpointValueNdx0 < numEndpointValues; endpointValueNdx0++)
						for (int endpointValueNdx1 = 0; endpointValueNdx1 < numEndpointValues; endpointValueNdx1++)
						{
							const int endpointValue0 = endpointValueNdx0 * endpointISERangeMax / (numEndpointValues-1);
							const int endpointValue1 = endpointValueNdx1 * endpointISERangeMax / (numEndpointValues-1);

							iseInputs.endpoint.value.plain[endpointPartNdx0] = endpointValue0;
							iseInputs.endpoint.value.plain[endpointPartNdx1] = endpointValue1;

							generateNormalBlock(blockParams, blockSize.x(), blockSize.y(), iseInputs).pushBytesToVector(dst);
						}
					}
				}
			}

			break;
		}

		case BLOCK_TEST_TYPE_ENDPOINT_ISE:
		// Similar to BLOCK_TEST_TYPE_WEIGHT_ISE, see above.
		{
			static const deUint32 endpointRangeMaximums[] = { 5, 9, 11, 19, 23, 39, 47, 79, 95, 159, 191 };

			for (int endpointRangeNdx = 0; endpointRangeNdx < DE_LENGTH_OF_ARRAY(endpointRangeMaximums); endpointRangeNdx++)
			{
				bool validCaseGenerated = false;

				for (int numPartitions = 1;			!validCaseGenerated && numPartitions <= 4;														numPartitions++)
				for (int isDual = 0;				!validCaseGenerated && isDual <= 1;																isDual++)
				for (int weightISEParamsNdx = 0;	!validCaseGenerated && weightISEParamsNdx < DE_LENGTH_OF_ARRAY(s_weightISEParamsCandidates);	weightISEParamsNdx++)
				for (int weightGridWidth = 2;		!validCaseGenerated && weightGridWidth <= 12;													weightGridWidth++)
				for (int weightGridHeight = 2;		!validCaseGenerated && weightGridHeight <= 12;													weightGridHeight++)
				{
					NormalBlockParams blockParams;
					blockParams.weightGridWidth				= weightGridWidth;
					blockParams.weightGridHeight			= weightGridHeight;
					blockParams.weightISEParams				= s_weightISEParamsCandidates[weightISEParamsNdx];
					blockParams.isDualPlane					= isDual != 0;
					blockParams.ccs							= 0;
					blockParams.numPartitions				= numPartitions;
					blockParams.isMultiPartSingleCemMode	= true;
					blockParams.colorEndpointModes[0]		= 12;
					blockParams.partitionSeed				= 634;

					if (isValidBlockParams(blockParams, blockSize.x(), blockSize.y()))
					{
						const ISEParams endpointISEParams = computeMaximumRangeISEParams(computeNumBitsForColorEndpoints(blockParams),
																						 computeNumColorEndpointValues(&blockParams.colorEndpointModes[0], numPartitions, true));

						if (computeISERangeMax(endpointISEParams) == endpointRangeMaximums[endpointRangeNdx])
						{
							validCaseGenerated = true;

							const int numColorEndpoints		= computeNumColorEndpointValues(&blockParams.colorEndpointModes[0], numPartitions, blockParams.isMultiPartSingleCemMode);
							const int numValuesInISEBlock	= endpointISEParams.mode == ISEMODE_TRIT ? 5 : endpointISEParams.mode == ISEMODE_QUINT ? 3 : 1;

							{
								const int				numColorEndpointValues	= (int)computeISERangeMax(endpointISEParams) + 1;
								const int				numBlocks				= deDivRoundUp32(numColorEndpointValues, numColorEndpoints);
								NormalBlockISEInputs	iseInputs				= generateDefaultISEInputs(blockParams);
								iseInputs.endpoint.isGivenInBlockForm = false;

								for (int offset = 0;	offset < numValuesInISEBlock;	offset++)
								for (int blockNdx = 0;	blockNdx < numBlocks;			blockNdx++)
								{
									for (int endpointNdx = 0; endpointNdx < numColorEndpoints; endpointNdx++)
										iseInputs.endpoint.value.plain[endpointNdx] = (blockNdx*numColorEndpoints + endpointNdx + offset) % numColorEndpointValues;

									generateNormalBlock(blockParams, blockSize.x(), blockSize.y(), iseInputs).pushBytesToVector(dst);
								}
							}

							if (endpointISEParams.mode == ISEMODE_TRIT || endpointISEParams.mode == ISEMODE_QUINT)
							{
								NormalBlockISEInputs iseInputs = generateDefaultISEInputs(blockParams);
								iseInputs.endpoint.isGivenInBlockForm = true;

								const int numTQValues			= 1 << (endpointISEParams.mode == ISEMODE_TRIT ? 8 : 7);
								const int numISEBlocksPerBlock	= deDivRoundUp32(numColorEndpoints, numValuesInISEBlock);
								const int numBlocks				= deDivRoundUp32(numTQValues, numISEBlocksPerBlock);

								for (int offset = 0;	offset < numValuesInISEBlock;	offset++)
								for (int blockNdx = 0;	blockNdx < numBlocks;			blockNdx++)
								{
									for (int iseBlockNdx = 0; iseBlockNdx < numISEBlocksPerBlock; iseBlockNdx++)
									{
										for (int i = 0; i < numValuesInISEBlock; i++)
											iseInputs.endpoint.value.block[iseBlockNdx].bitValues[i] = 0;
										iseInputs.endpoint.value.block[iseBlockNdx].tOrQValue = (blockNdx*numISEBlocksPerBlock + iseBlockNdx + offset) % numTQValues;
									}

									generateNormalBlock(blockParams, blockSize.x(), blockSize.y(), iseInputs).pushBytesToVector(dst);
								}
							}
						}
					}
				}

				DE_ASSERT(validCaseGenerated);
			}

			break;
		}

		case BLOCK_TEST_TYPE_CCS:
		// For all partition counts, test all values of the CCS (color component selector).
		{
			for (int		numPartitions = 1;		numPartitions <= 3;		numPartitions++)
			for (deUint32	ccs = 0;				ccs < 4;				ccs++)
			{
				NormalBlockParams blockParams;
				blockParams.weightGridWidth				= 3;
				blockParams.weightGridHeight			= 3;
				blockParams.weightISEParams				= ISEParams(ISEMODE_PLAIN_BIT, 2);
				blockParams.isDualPlane					= true;
				blockParams.ccs							= ccs;
				blockParams.numPartitions				= numPartitions;
				blockParams.isMultiPartSingleCemMode	= true;
				blockParams.colorEndpointModes[0]		= 8;
				blockParams.partitionSeed				= 634;

				generateNormalBlock(blockParams, blockSize.x(), blockSize.y(), generateDefaultISEInputs(blockParams)).pushBytesToVector(dst);
			}

			break;
		}

		case BLOCK_TEST_TYPE_RANDOM:
		// Generate a number of random (including invalid) blocks.
		{
			const int		numBlocks	= 16384;
			const deUint32	seed		= 1;

			dst.resize(numBlocks*BLOCK_SIZE_BYTES);

			generateRandomBlocks(&dst[0], numBlocks, format, seed);

			break;
		}

		default:
			DE_ASSERT(false);
	}
}